

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

void __thiscall Iex::BaseExc::BaseExc(BaseExc *this,BaseExc *be)

{
  pointer pcVar1;
  
  (this->super_string)._M_dataplus._M_p = (pointer)&(this->super_string).field_2;
  pcVar1 = (be->super_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->super_string,pcVar1,pcVar1 + (be->super_string)._M_string_length);
  *(undefined ***)this = &PTR__BaseExc_00159d58;
  (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
  pcVar1 = (be->_stackTrace)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_stackTrace,pcVar1,pcVar1 + (be->_stackTrace)._M_string_length);
  return;
}

Assistant:

BaseExc::BaseExc (const BaseExc &be) throw () :
    std::string (be),
    _stackTrace (be._stackTrace)
{
    // empty
}